

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_lib.h
# Opt level: O0

void __thiscall
ze_lib::context_t::debug_trace_message(context_t *this,string *message,string *result)

{
  ostream *poVar1;
  allocator local_41;
  string local_40 [8];
  string debugTracePrefix;
  string *result_local;
  string *message_local;
  context_t *this_local;
  
  if ((this->debugTraceEnabled & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"ZE_LOADER_DEBUG_TRACE:",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    poVar1 = std::operator<<((ostream *)&std::cerr,local_40);
    poVar1 = std::operator<<(poVar1,(string *)message);
    poVar1 = std::operator<<(poVar1,(string *)result);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

__zedlllocal void debug_trace_message(std::string message, std::string result) {
        if (debugTraceEnabled){
            std::string debugTracePrefix = "ZE_LOADER_DEBUG_TRACE:";
            std::cerr << debugTracePrefix << message << result << std::endl;
        }
    }